

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InterestCalculator.c
# Opt level: O1

int main(void)

{
  float principal;
  float rate;
  int term;
  float local_3c;
  float local_38;
  int local_34;
  
  local_34 = 0;
  local_38 = 0.0;
  local_3c = 0.0;
  printf("%s","Enter loan principal (-1 to end): ");
  __isoc99_scanf("%f",&local_3c);
  if ((local_3c != -1.0) || (NAN(local_3c))) {
    do {
      do {
        printf("%s","Enter interest rate: ");
        __isoc99_scanf("%f",&local_38);
        printf("%s","Enter term of the loan in days: ");
        __isoc99_scanf("%d",&local_34);
        printf("%s %0.2f\n\n",(double)(((float)local_34 / 365.0) * local_3c * local_38),
               "The interest charge is $");
        printf("%s","Enter loan principal (-1 to end): ");
        __isoc99_scanf("%f",&local_3c);
      } while (local_3c != -1.0);
    } while (NAN(local_3c));
  }
  return 0;
}

Assistant:

int main (void) {
    int term = 0;
    float rate = 0;
    float principal = 0;
    float interest = 0;

    printf("%s", "Enter loan principal (-1 to end): ");
    scanf("%f", &principal);
    while (principal != -1) {
        printf("%s", "Enter interest rate: ");
        scanf("%f", &rate);
        printf("%s", "Enter term of the loan in days: ");
        scanf("%d", &term);

        interest = principal * rate * ((float)term/365);
        printf("%s %0.2f\n\n", "The interest charge is $", interest);

        printf("%s", "Enter loan principal (-1 to end): ");
        scanf("%f", &principal);

    }

    return 0;

}